

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O0

bool __thiscall VertexAttrib64Bit::LimitTest::testIteration(LimitTest *this,_iteration iteration)

{
  bool bVar1;
  GLenum err;
  Functions *gl_functions;
  undefined1 local_e8 [8];
  programInfo use_array_use_location_per_instance;
  programInfo _no_array_use_location_per_instance;
  programInfo use_array__no_location_per_instance;
  programInfo _no_array__no_location_per_instance;
  programInfo use_array_use_location______regular;
  programInfo _no_array_use_location______regular;
  undefined1 local_48 [8];
  programInfo use_array__no_location______regular;
  programInfo _no_array__no_location______regular;
  bool result;
  _iteration iteration_local;
  LimitTest *this_local;
  
  gl_functions = &(this->super_Base).gl;
  programInfo::programInfo((programInfo *)&use_array__no_location______regular.gl,gl_functions);
  programInfo::programInfo((programInfo *)local_48,gl_functions);
  programInfo::programInfo
            ((programInfo *)&use_array_use_location______regular.gl,&(this->super_Base).gl);
  programInfo::programInfo
            ((programInfo *)&_no_array__no_location_per_instance.gl,&(this->super_Base).gl);
  programInfo::programInfo
            ((programInfo *)&use_array__no_location_per_instance.gl,&(this->super_Base).gl);
  programInfo::programInfo
            ((programInfo *)&_no_array_use_location_per_instance.gl,&(this->super_Base).gl);
  programInfo::programInfo
            ((programInfo *)&use_array_use_location_per_instance.gl,&(this->super_Base).gl);
  programInfo::programInfo((programInfo *)local_e8,&(this->super_Base).gl);
  prepareProgram(this,iteration,false,false,false,
                 (programInfo *)&use_array__no_location______regular.gl);
  prepareProgram(this,iteration,true,false,false,(programInfo *)local_48);
  prepareProgram(this,iteration,false,true,false,
                 (programInfo *)&use_array_use_location______regular.gl);
  prepareProgram(this,iteration,true,true,false,
                 (programInfo *)&_no_array__no_location_per_instance.gl);
  prepareProgram(this,iteration,false,false,true,
                 (programInfo *)&use_array__no_location_per_instance.gl);
  prepareProgram(this,iteration,true,false,true,
                 (programInfo *)&_no_array_use_location_per_instance.gl);
  prepareProgram(this,iteration,false,true,true,
                 (programInfo *)&use_array_use_location_per_instance.gl);
  prepareProgram(this,iteration,true,true,true,(programInfo *)local_e8);
  (*(this->super_Base).gl.bindBuffer)(0x8893,this->m_element_array_buffer_id);
  (*(this->super_Base).gl.bindBufferRange)(0x8c8e,0,this->m_transoform_feedback_buffer_id,0,0x10000)
  ;
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xabe);
  prepareVertexArrayBuffer(this,iteration);
  bVar1 = testProgram(this,iteration,use_array__no_location______regular.gl._4_4_,false);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,REGULAR,false,false);
  }
  _no_array__no_location______regular.gl._3_1_ = bVar1;
  bVar1 = testProgram(this,iteration,local_48._4_4_,true);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,REGULAR,true,false);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgram(this,iteration,use_array_use_location______regular.gl._4_4_,false);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,REGULAR,false,true);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgram(this,iteration,_no_array__no_location_per_instance.gl._4_4_,true);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,REGULAR,true,true);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgramWithConstant(this,iteration,use_array__no_location_per_instance.gl._4_4_,false)
  ;
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,CONSTANT,false,false);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgramWithConstant(this,iteration,_no_array_use_location_per_instance.gl._4_4_,true);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,CONSTANT,true,false);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgramWithConstant(this,iteration,use_array_use_location_per_instance.gl._4_4_,false)
  ;
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,CONSTANT,false,true);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgramWithConstant(this,iteration,local_e8._4_4_,true);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,CONSTANT,true,true);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgramWithDivisor(this,iteration,use_array__no_location_per_instance.gl._4_4_,false);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,PER_INSTANCE,false,false);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgramWithDivisor(this,iteration,_no_array_use_location_per_instance.gl._4_4_,true);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,PER_INSTANCE,true,false);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgramWithDivisor(this,iteration,use_array_use_location_per_instance.gl._4_4_,false);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,PER_INSTANCE,false,true);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  bVar1 = testProgramWithDivisor(this,iteration,local_e8._4_4_,true);
  if (!bVar1) {
    logTestIterationAndConfig(this,iteration,PER_INSTANCE,true,true);
    _no_array__no_location______regular.gl._3_1_ = false;
  }
  programInfo::~programInfo((programInfo *)local_e8);
  programInfo::~programInfo((programInfo *)&use_array_use_location_per_instance.gl);
  programInfo::~programInfo((programInfo *)&_no_array_use_location_per_instance.gl);
  programInfo::~programInfo((programInfo *)&use_array__no_location_per_instance.gl);
  programInfo::~programInfo((programInfo *)&_no_array__no_location_per_instance.gl);
  programInfo::~programInfo((programInfo *)&use_array_use_location______regular.gl);
  programInfo::~programInfo((programInfo *)local_48);
  programInfo::~programInfo((programInfo *)&use_array__no_location______regular.gl);
  return _no_array__no_location______regular.gl._3_1_;
}

Assistant:

bool LimitTest::testIteration(_iteration iteration)
{
	bool result = true;

	/* Program infos */
	programInfo _no_array__no_location______regular(gl);
	programInfo use_array__no_location______regular(gl);
	programInfo _no_array_use_location______regular(gl);
	programInfo use_array_use_location______regular(gl);
	programInfo _no_array__no_location_per_instance(gl);
	programInfo use_array__no_location_per_instance(gl);
	programInfo _no_array_use_location_per_instance(gl);
	programInfo use_array_use_location_per_instance(gl);

	/* Prepare programs for all configuration */
	prepareProgram(iteration, false, false, false, _no_array__no_location______regular);
	prepareProgram(iteration, true, false, false, use_array__no_location______regular);
	prepareProgram(iteration, false, true, false, _no_array_use_location______regular);
	prepareProgram(iteration, true, true, false, use_array_use_location______regular);
	prepareProgram(iteration, false, false, true, _no_array__no_location_per_instance);
	prepareProgram(iteration, true, false, true, use_array__no_location_per_instance);
	prepareProgram(iteration, false, true, true, _no_array_use_location_per_instance);
	prepareProgram(iteration, true, true, true, use_array_use_location_per_instance);

	/* Bind buffers */
	gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_element_array_buffer_id);
	gl.bindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, m_transoform_feedback_buffer_id, 0,
					   m_transform_feedback_buffer_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindBufferRange");

	/* Prepare vertex array buffer for iteration */
	prepareVertexArrayBuffer(iteration);

	/* Regular and instanced draw calls, vertex attribute divisor: 0 */
	if (false == testProgram(iteration, _no_array__no_location______regular.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, REGULAR, false /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgram(iteration, use_array__no_location______regular.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, REGULAR, true /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgram(iteration, _no_array_use_location______regular.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, REGULAR, false /* use_arrays */, true /* use_locations */);

		result = false;
	}

	if (false == testProgram(iteration, use_array_use_location______regular.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, REGULAR, true /* use_arrays */, true /* use_locations */);

		result = false;
	}

	/* Regular draw calls, constant vertex attribute */
	if (false == testProgramWithConstant(iteration, _no_array__no_location_per_instance.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, CONSTANT, false /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgramWithConstant(iteration, use_array__no_location_per_instance.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, CONSTANT, true /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgramWithConstant(iteration, _no_array_use_location_per_instance.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, CONSTANT, false /* use_arrays */, true /* use_locations */);

		result = false;
	}

	if (false == testProgramWithConstant(iteration, use_array_use_location_per_instance.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, CONSTANT, true /* use_arrays */, true /* use_locations */);

		result = false;
	}

	/* Instanced draw calls, vertex attribute divisor: 1 */
	if (false == testProgramWithDivisor(iteration, _no_array__no_location_per_instance.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, PER_INSTANCE, false /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgramWithDivisor(iteration, use_array__no_location_per_instance.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, PER_INSTANCE, true /* use_arrays */, false /* use_locations */);

		result = false;
	}

	if (false == testProgramWithDivisor(iteration, _no_array_use_location_per_instance.m_program_id, false))
	{
		logTestIterationAndConfig(iteration, PER_INSTANCE, false /* use_arrays */, true /* use_locations */);

		result = false;
	}

	if (false == testProgramWithDivisor(iteration, use_array_use_location_per_instance.m_program_id, true))
	{
		logTestIterationAndConfig(iteration, PER_INSTANCE, true /* use_arrays */, true /* use_locations */);

		result = false;
	}

	/* Done */
	return result;
}